

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglGLES2SharingTests.cpp
# Opt level: O3

void __thiscall
deqp::egl::GLES2ShaderSharingTest::renderResource
          (GLES2ShaderSharingTest *this,Surface *screen,Surface *reference)

{
  ostringstream *poVar1;
  glReadPixelsFunc p_Var2;
  uint uVar3;
  GLuint GVar4;
  GLenum GVar5;
  GLuint GVar6;
  MessageBuilder *pMVar7;
  size_t sVar8;
  TestError *this_00;
  int iVar9;
  uint uVar10;
  int iVar11;
  char *msg;
  int iVar12;
  void *pvVar13;
  int iVar14;
  int iVar15;
  float fVar16;
  int iVar17;
  int iVar18;
  float t;
  float fVar19;
  float fVar20;
  float fVar21;
  uint uVar22;
  float fVar23;
  uint uVar24;
  float fVar25;
  uint uVar26;
  uint uVar27;
  float fVar28;
  uint uVar29;
  uint uVar30;
  char *fragmentShader;
  char *vertexShader;
  GLint status;
  char buffer [256];
  char *local_2d8;
  char *local_2d0;
  GLsizei local_2c4;
  GLsizei local_2c0;
  GLint local_2bc;
  undefined1 local_2b8 [32];
  void *local_298;
  ios_base local_240 [264];
  IVec4 local_138 [16];
  
  local_2d0 = 
  "attribute mediump vec2 a_pos;\nattribute mediump vec4 a_color;\nvarying mediump vec4 v_color;\nvoid main(void)\n{\n\tv_color = a_color;\n\tgl_Position = vec4(a_pos, 0.0, 1.0);\n}\n"
  ;
  local_2d8 = "varying mediump vec4 v_color;\nvoid main(void)\n{\n\tgl_FragColor = v_color;\n}\n";
  if (this->m_shaderType == 0x8b30) {
    GVar4 = (*(this->super_GLES2SharingTest).m_gl.createShader)(0x8b31);
    GVar5 = (*(this->super_GLES2SharingTest).m_gl.getError)();
    glu::checkError(GVar5,"glCreateShader()",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglGLES2SharingTests.cpp"
                    ,0x391);
    (*(this->super_GLES2SharingTest).m_gl.shaderSource)(GVar4,1,&local_2d0,(GLint *)0x0);
    GVar5 = (*(this->super_GLES2SharingTest).m_gl.getError)();
    msg = "shaderSource(otherShader, 1, &vertexShader, DE_NULL)";
    iVar17 = 0x392;
LAB_00de4ee7:
    glu::checkError(GVar5,msg,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglGLES2SharingTests.cpp"
                    ,iVar17);
  }
  else {
    GVar4 = 0xffffffff;
    if (this->m_shaderType == 0x8b31) {
      GVar4 = (*(this->super_GLES2SharingTest).m_gl.createShader)(0x8b30);
      GVar5 = (*(this->super_GLES2SharingTest).m_gl.getError)();
      glu::checkError(GVar5,"glCreateShader()",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglGLES2SharingTests.cpp"
                      ,0x38b);
      (*(this->super_GLES2SharingTest).m_gl.shaderSource)(GVar4,1,&local_2d8,(GLint *)0x0);
      GVar5 = (*(this->super_GLES2SharingTest).m_gl.getError)();
      msg = "shaderSource(otherShader, 1, &fragmentShader, DE_NULL)";
      iVar17 = 0x38c;
      goto LAB_00de4ee7;
    }
  }
  (*(this->super_GLES2SharingTest).m_gl.compileShader)(GVar4);
  GVar5 = (*(this->super_GLES2SharingTest).m_gl.getError)();
  glu::checkError(GVar5,"compileShader(otherShader)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglGLES2SharingTests.cpp"
                  ,0x399);
  local_2bc = 0;
  (*(this->super_GLES2SharingTest).m_gl.getShaderiv)(GVar4,0x8b81,&local_2bc);
  GVar5 = (*(this->super_GLES2SharingTest).m_gl.getError)();
  glu::checkError(GVar5,"getShaderiv(otherShader, GL_COMPILE_STATUS, &status)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglGLES2SharingTests.cpp"
                  ,0x39c);
  if (local_2bc != 0) {
    GVar6 = (*(this->super_GLES2SharingTest).m_gl.createProgram)();
    GVar5 = (*(this->super_GLES2SharingTest).m_gl.getError)();
    glu::checkError(GVar5,"glCreateProgram()",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglGLES2SharingTests.cpp"
                    ,0x3b8);
    (*(this->super_GLES2SharingTest).m_gl.attachShader)(GVar6,this->m_shader);
    GVar5 = (*(this->super_GLES2SharingTest).m_gl.getError)();
    glu::checkError(GVar5,"attachShader(program, m_shader)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglGLES2SharingTests.cpp"
                    ,0x3ba);
    (*(this->super_GLES2SharingTest).m_gl.attachShader)(GVar6,GVar4);
    GVar5 = (*(this->super_GLES2SharingTest).m_gl.getError)();
    glu::checkError(GVar5,"attachShader(program, otherShader)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglGLES2SharingTests.cpp"
                    ,0x3bb);
    (*(this->super_GLES2SharingTest).m_gl.linkProgram)(GVar6);
    GVar5 = (*(this->super_GLES2SharingTest).m_gl.getError)();
    glu::checkError(GVar5,"linkProgram(program)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglGLES2SharingTests.cpp"
                    ,0x3bd);
    (*(this->super_GLES2SharingTest).m_gl.deleteShader)(GVar4);
    GVar5 = (*(this->super_GLES2SharingTest).m_gl.getError)();
    glu::checkError(GVar5,"deleteShader(otherShader)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglGLES2SharingTests.cpp"
                    ,0x3be);
    local_2bc = 0;
    (*(this->super_GLES2SharingTest).m_gl.getProgramiv)(GVar6,0x8b82,&local_2bc);
    GVar5 = (*(this->super_GLES2SharingTest).m_gl.getError)();
    glu::checkError(GVar5,"getProgramiv(program, GL_LINK_STATUS, &status)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglGLES2SharingTests.cpp"
                    ,0x3c1);
    if (local_2bc == 0) {
      (*(this->super_GLES2SharingTest).m_gl.getProgramInfoLog)
                (GVar6,0x100,(GLsizei *)0x0,(GLchar *)local_138);
      GVar5 = (*(this->super_GLES2SharingTest).m_gl.getError)();
      glu::checkError(GVar5,"getProgramInfoLog(program, 256, DE_NULL, buffer)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglGLES2SharingTests.cpp"
                      ,0x3c6);
      local_2b8._0_8_ = (this->super_GLES2SharingTest).m_log;
      poVar1 = (ostringstream *)(local_2b8 + 8);
      std::__cxx11::ostringstream::ostringstream(poVar1);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)poVar1,"Failed to link program",0x16);
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)local_2b8,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::ostringstream::~ostringstream(poVar1);
      std::ios_base::~ios_base(local_240);
      local_2b8._0_8_ = (this->super_GLES2SharingTest).m_log;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)(local_2b8 + 8));
      pMVar7 = tcu::MessageBuilder::operator<<((MessageBuilder *)local_2b8,&local_2d0);
      tcu::MessageBuilder::operator<<(pMVar7,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)(local_2b8 + 8));
      std::ios_base::~ios_base(local_240);
      local_2b8._0_8_ = (this->super_GLES2SharingTest).m_log;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)(local_2b8 + 8));
      pMVar7 = tcu::MessageBuilder::operator<<((MessageBuilder *)local_2b8,&local_2d8);
      tcu::MessageBuilder::operator<<(pMVar7,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)(local_2b8 + 8));
      std::ios_base::~ios_base(local_240);
      local_2b8._0_8_ = (this->super_GLES2SharingTest).m_log;
      poVar1 = (ostringstream *)(local_2b8 + 8);
      std::__cxx11::ostringstream::ostringstream(poVar1);
      sVar8 = strlen((char *)local_138);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,(char *)local_138,sVar8);
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)local_2b8,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::ostringstream::~ostringstream(poVar1);
      std::ios_base::~ios_base(local_240);
      this_00 = (TestError *)__cxa_allocate_exception(0x38);
      tcu::TestError::TestError
                (this_00,"Failed to link program",(char *)0x0,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglGLES2SharingTests.cpp"
                 ,0x3cd);
    }
    else {
      if (screen == (Surface *)0x0) {
        local_2c4 = 0xf0;
        local_2c0 = 0xf0;
      }
      else {
        local_2c0 = screen->m_width;
        local_2c4 = screen->m_height;
      }
      (*(this->super_GLES2SharingTest).m_gl.viewport)(0,0,local_2c0,local_2c4);
      GVar5 = (*(this->super_GLES2SharingTest).m_gl.getError)();
      glu::checkError(GVar5,"viewport(0, 0, width, height)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglGLES2SharingTests.cpp"
                      ,0x3e9);
      (*(this->super_GLES2SharingTest).m_gl.clearColor)(1.0,0.0,0.0,1.0);
      GVar5 = (*(this->super_GLES2SharingTest).m_gl.getError)();
      glu::checkError(GVar5,"clearColor(1.0f, 0.0f, 0.0f, 1.0f)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglGLES2SharingTests.cpp"
                      ,0x3eb);
      (*(this->super_GLES2SharingTest).m_gl.clear)(0x4000);
      GVar5 = (*(this->super_GLES2SharingTest).m_gl.getError)();
      glu::checkError(GVar5,"clear(GL_COLOR_BUFFER_BIT)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglGLES2SharingTests.cpp"
                      ,0x3ec);
      (*(this->super_GLES2SharingTest).m_gl.useProgram)(GVar6);
      GVar5 = (*(this->super_GLES2SharingTest).m_gl.getError)();
      glu::checkError(GVar5,"useProgram(program)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglGLES2SharingTests.cpp"
                      ,0x3ee);
      GVar4 = (*(this->super_GLES2SharingTest).m_gl.getAttribLocation)(GVar6,"a_pos");
      GVar5 = (*(this->super_GLES2SharingTest).m_gl.getError)();
      glu::checkError(GVar5,"glGetAttribLocation()",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglGLES2SharingTests.cpp"
                      ,0x3f1);
      if (GVar4 == 0xffffffff) {
        this_00 = (TestError *)__cxa_allocate_exception(0x38);
        tcu::TestError::TestError
                  (this_00,(char *)0x0,"coordLocation != (GLuint)-1",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglGLES2SharingTests.cpp"
                   ,0x3f2);
      }
      else {
        GVar6 = (*(this->super_GLES2SharingTest).m_gl.getAttribLocation)(GVar6,"a_color");
        GVar5 = (*(this->super_GLES2SharingTest).m_gl.getError)();
        glu::checkError(GVar5,"glGetAttribLocation()",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglGLES2SharingTests.cpp"
                        ,0x3f5);
        if (GVar6 != 0xffffffff) {
          (*(this->super_GLES2SharingTest).m_gl.enableVertexAttribArray)(GVar6);
          GVar5 = (*(this->super_GLES2SharingTest).m_gl.getError)();
          glu::checkError(GVar5,"enableVertexAttribArray(colorLocation)",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglGLES2SharingTests.cpp"
                          ,0x3f8);
          (*(this->super_GLES2SharingTest).m_gl.enableVertexAttribArray)(GVar4);
          GVar5 = (*(this->super_GLES2SharingTest).m_gl.getError)();
          glu::checkError(GVar5,"enableVertexAttribArray(coordLocation)",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglGLES2SharingTests.cpp"
                          ,0x3f9);
          (*(this->super_GLES2SharingTest).m_gl.vertexAttribPointer)
                    (GVar6,4,0x1406,'\0',0,renderResource::colors);
          GVar5 = (*(this->super_GLES2SharingTest).m_gl.getError)();
          glu::checkError(GVar5,
                          "vertexAttribPointer(colorLocation, 4, GL_FLOAT, GL_FALSE, 0, colors)",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglGLES2SharingTests.cpp"
                          ,0x3fb);
          (*(this->super_GLES2SharingTest).m_gl.vertexAttribPointer)
                    (GVar4,2,0x1406,'\0',0,renderResource::coords);
          GVar5 = (*(this->super_GLES2SharingTest).m_gl.getError)();
          glu::checkError(GVar5,
                          "vertexAttribPointer(coordLocation, 2, GL_FLOAT, GL_FALSE, 0, coords)",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglGLES2SharingTests.cpp"
                          ,0x3fc);
          (*(this->super_GLES2SharingTest).m_gl.drawElements)(4,6,0x1403,renderResource::indices);
          GVar5 = (*(this->super_GLES2SharingTest).m_gl.getError)();
          glu::checkError(GVar5,"drawElements(GL_TRIANGLES, 6, GL_UNSIGNED_SHORT, indices)",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglGLES2SharingTests.cpp"
                          ,0x3fe);
          (*(this->super_GLES2SharingTest).m_gl.disableVertexAttribArray)(GVar4);
          GVar5 = (*(this->super_GLES2SharingTest).m_gl.getError)();
          glu::checkError(GVar5,"disableVertexAttribArray(coordLocation)",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglGLES2SharingTests.cpp"
                          ,0x3ff);
          (*(this->super_GLES2SharingTest).m_gl.disableVertexAttribArray)(GVar6);
          GVar5 = (*(this->super_GLES2SharingTest).m_gl.getError)();
          glu::checkError(GVar5,"disableVertexAttribArray(colorLocation)",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglGLES2SharingTests.cpp"
                          ,0x400);
          (*(this->super_GLES2SharingTest).m_gl.useProgram)(0);
          GVar5 = (*(this->super_GLES2SharingTest).m_gl.getError)();
          glu::checkError(GVar5,"useProgram(0)",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglGLES2SharingTests.cpp"
                          ,0x401);
          if (screen != (Surface *)0x0) {
            p_Var2 = (this->super_GLES2SharingTest).m_gl.readPixels;
            iVar17 = screen->m_width;
            iVar18 = screen->m_height;
            local_138[0].m_data[0] = RGBA;
            local_138[0].m_data[1] = UNORM_INT8;
            pvVar13 = (void *)(screen->m_pixels).m_cap;
            if (pvVar13 != (void *)0x0) {
              pvVar13 = (screen->m_pixels).m_ptr;
            }
            tcu::PixelBufferAccess::PixelBufferAccess
                      ((PixelBufferAccess *)local_2b8,(TextureFormat *)local_138,iVar17,iVar18,1,
                       pvVar13);
            (*p_Var2)(0,0,iVar17,iVar18,0x1908,0x1401,local_298);
            local_138[0].m_data[0] = RGBA;
            local_138[0].m_data[1] = UNORM_INT8;
            pvVar13 = (void *)(reference->m_pixels).m_cap;
            if (pvVar13 != (void *)0x0) {
              pvVar13 = (reference->m_pixels).m_ptr;
            }
            tcu::PixelBufferAccess::PixelBufferAccess
                      ((PixelBufferAccess *)local_2b8,(TextureFormat *)local_138,reference->m_width,
                       reference->m_height,1,pvVar13);
            local_138[0].m_data[0] = 0xff;
            local_138[0].m_data[1] = SNORM_INT8;
            local_138[0].m_data[2] = 0;
            local_138[0].m_data[3] = 0xff;
            tcu::clear((PixelBufferAccess *)local_2b8,local_138);
            fVar16 = (float)local_2c0 * 0.5;
            iVar17 = (int)(fVar16 * -0.9 + fVar16);
            iVar18 = (int)(fVar16 * 0.9 + fVar16);
            if (iVar17 <= iVar18) {
              fVar16 = (float)local_2c4 * 0.5;
              iVar9 = (int)(fVar16 * -0.9 + fVar16);
              iVar11 = (int)(fVar16 * 0.9 + fVar16);
              iVar12 = iVar17;
              do {
                if (iVar9 <= iVar11) {
                  fVar16 = (float)(iVar12 - iVar17) / (float)(iVar18 - iVar17);
                  fVar19 = 1.0 - fVar16;
                  pvVar13 = (reference->m_pixels).m_ptr;
                  iVar14 = 0;
                  do {
                    fVar20 = (float)iVar14 / (float)(iVar11 - iVar9);
                    if (fVar16 <= fVar20) {
                      fVar28 = 1.0 - fVar20;
                      fVar20 = fVar20 - fVar16;
                      fVar21 = fVar20 * 0.0 + fVar28 * 0.0 + fVar16 * 0.0;
                      fVar23 = fVar20 * 0.0 + fVar28 * 0.0 + fVar16 * 1.0;
                      fVar25 = fVar20 * 1.0 + fVar28 * 0.0 + fVar16 * 0.0;
                      fVar20 = fVar20 * 1.0 + fVar28 * 1.0 + fVar16 * 1.0;
                    }
                    else {
                      fVar28 = fVar16 - fVar20;
                      fVar21 = fVar20 * 0.0 + fVar28 * 1.0 + fVar19 * 0.0;
                      fVar23 = fVar20 * 1.0 + fVar28 * 0.0 + fVar19 * 0.0;
                      fVar25 = fVar20 * 0.0 + fVar28 * 0.0 + fVar19 * 0.0;
                      fVar20 = fVar20 * 1.0 + fVar28 * 1.0 + fVar19 * 1.0;
                    }
                    uVar22 = (uint)(fVar21 * 255.0);
                    uVar24 = (uint)(fVar23 * 255.0);
                    uVar26 = (uint)(fVar25 * 255.0);
                    uVar27 = (uint)(fVar20 * 255.0);
                    uVar3 = uVar22;
                    if (0xfe < uVar22) {
                      uVar3 = 0xff;
                    }
                    uVar10 = uVar24;
                    if (0xfe < uVar24) {
                      uVar10 = 0xff;
                    }
                    uVar29 = -(uint)(-0x7fffff02 < (int)(uVar26 ^ 0x80000000));
                    uVar30 = -(uint)(-0x7fffff02 < (int)(uVar27 ^ 0x80000000));
                    *(uint *)((long)pvVar13 +
                             (long)((iVar9 + iVar14) * reference->m_width + iVar12) * 4) =
                         ~((int)uVar27 >> 0x1f) & (uVar30 >> 0x18 | ~uVar30 & uVar27) << 0x18 |
                         ~((int)uVar24 >> 0x1f) & uVar10 << 8 |
                         ~((int)uVar26 >> 0x1f) & (uVar29 >> 0x18 | ~uVar29 & uVar26) << 0x10 |
                         ~((int)uVar22 >> 0x1f) & uVar3;
                    iVar15 = iVar9 + iVar14;
                    iVar14 = iVar14 + 1;
                  } while (iVar15 + 1 <= iVar11);
                }
                iVar12 = iVar12 + 1;
              } while (iVar12 <= iVar18);
            }
          }
          return;
        }
        this_00 = (TestError *)__cxa_allocate_exception(0x38);
        tcu::TestError::TestError
                  (this_00,(char *)0x0,"colorLocation != (GLuint)-1",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglGLES2SharingTests.cpp"
                   ,0x3f6);
      }
    }
    goto LAB_00de593f;
  }
  (*(this->super_GLES2SharingTest).m_gl.getShaderInfoLog)
            (GVar4,0x100,(GLsizei *)0x0,(GLchar *)local_138);
  GVar5 = (*(this->super_GLES2SharingTest).m_gl.getError)();
  glu::checkError(GVar5,"getShaderInfoLog(otherShader, 256, DE_NULL, buffer)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglGLES2SharingTests.cpp"
                  ,0x3a1);
  local_2b8._0_8_ = (this->super_GLES2SharingTest).m_log;
  poVar1 = (ostringstream *)(local_2b8 + 8);
  std::__cxx11::ostringstream::ostringstream(poVar1);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)poVar1,"Failed to compile shader",0x18);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_2b8,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream(poVar1);
  std::ios_base::~ios_base(local_240);
  if (this->m_shaderType == 0x8b30) {
    local_2b8._0_8_ = (this->super_GLES2SharingTest).m_log;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)(local_2b8 + 8));
    pMVar7 = tcu::MessageBuilder::operator<<((MessageBuilder *)local_2b8,&local_2d0);
    tcu::MessageBuilder::operator<<(pMVar7,(EndMessageToken *)&tcu::TestLog::EndMessage);
LAB_00de598b:
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)(local_2b8 + 8));
    std::ios_base::~ios_base(local_240);
  }
  else if (this->m_shaderType == 0x8b31) {
    local_2b8._0_8_ = (this->super_GLES2SharingTest).m_log;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)(local_2b8 + 8));
    pMVar7 = tcu::MessageBuilder::operator<<((MessageBuilder *)local_2b8,&local_2d8);
    tcu::MessageBuilder::operator<<(pMVar7,(EndMessageToken *)&tcu::TestLog::EndMessage);
    goto LAB_00de598b;
  }
  local_2b8._0_8_ = (this->super_GLES2SharingTest).m_log;
  poVar1 = (ostringstream *)(local_2b8 + 8);
  std::__cxx11::ostringstream::ostringstream(poVar1);
  sVar8 = strlen((char *)local_138);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,(char *)local_138,sVar8);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_2b8,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream(poVar1);
  std::ios_base::~ios_base(local_240);
  this_00 = (TestError *)__cxa_allocate_exception(0x38);
  tcu::TestError::TestError
            (this_00,"Failed to compile shader",(char *)0x0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglGLES2SharingTests.cpp"
             ,0x3b4);
LAB_00de593f:
  __cxa_throw(this_00,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
}

Assistant:

void GLES2ShaderSharingTest::renderResource (tcu::Surface* screen, tcu::Surface* reference)
{
	DE_ASSERT((screen && reference) || (!screen && !reference));

	int width = 240;
	int height = 240;

	const char* vertexShader = ""
	"attribute mediump vec2 a_pos;\n"
	"attribute mediump vec4 a_color;\n"
	"varying mediump vec4 v_color;\n"
	"void main(void)\n"
	"{\n"
	"\tv_color = a_color;\n"
	"\tgl_Position = vec4(a_pos, 0.0, 1.0);\n"
	"}\n";

	const char* fragmentShader = ""
	"varying mediump vec4 v_color;\n"
	"void main(void)\n"
	"{\n"
	"\tgl_FragColor = v_color;\n"
	"}\n";


	GLuint otherShader = (GLuint)-1;

	switch (m_shaderType)
	{
		case GL_VERTEX_SHADER:
			otherShader = m_gl.createShader(GL_FRAGMENT_SHADER);
			GLU_CHECK_GLW_MSG(m_gl, "glCreateShader()");
			GLU_CHECK_GLW_CALL(m_gl, shaderSource(otherShader, 1, &fragmentShader, DE_NULL));
			break;

		case GL_FRAGMENT_SHADER:
			otherShader = m_gl.createShader(GL_VERTEX_SHADER);
			GLU_CHECK_GLW_MSG(m_gl, "glCreateShader()");
			GLU_CHECK_GLW_CALL(m_gl, shaderSource(otherShader, 1, &vertexShader, DE_NULL));
			break;

		default:
			DE_ASSERT(false);
	}

	GLU_CHECK_GLW_CALL(m_gl, compileShader(otherShader));

	GLint status = 0;
	GLU_CHECK_GLW_CALL(m_gl, getShaderiv(otherShader, GL_COMPILE_STATUS, &status));

	if (!status)
	{
		char buffer[256];
		GLU_CHECK_GLW_CALL(m_gl, getShaderInfoLog(otherShader, 256, DE_NULL, buffer));

		m_log << tcu::TestLog::Message << "Failed to compile shader" << tcu::TestLog::EndMessage;

		switch (m_shaderType)
		{
			case GL_FRAGMENT_SHADER:
				m_log << tcu::TestLog::Message << vertexShader << tcu::TestLog::EndMessage;
				break;

			case GL_VERTEX_SHADER:
				m_log << tcu::TestLog::Message << fragmentShader << tcu::TestLog::EndMessage;
				break;

			default:
				DE_ASSERT(false);
		}

		m_log << tcu::TestLog::Message << buffer << tcu::TestLog::EndMessage;
		TCU_FAIL("Failed to compile shader");
	}

	GLuint program = m_gl.createProgram();
	GLU_CHECK_GLW_MSG(m_gl, "glCreateProgram()");

	GLU_CHECK_GLW_CALL(m_gl, attachShader(program, m_shader));
	GLU_CHECK_GLW_CALL(m_gl, attachShader(program, otherShader));

	GLU_CHECK_GLW_CALL(m_gl, linkProgram(program));
	GLU_CHECK_GLW_CALL(m_gl, deleteShader(otherShader));

	status = 0;
	GLU_CHECK_GLW_CALL(m_gl, getProgramiv(program, GL_LINK_STATUS, &status));

	if (!status)
	{
		char buffer[256];
		GLU_CHECK_GLW_CALL(m_gl, getProgramInfoLog(program, 256, DE_NULL, buffer));

		m_log << tcu::TestLog::Message << "Failed to link program" << tcu::TestLog::EndMessage;

		m_log << tcu::TestLog::Message << vertexShader << tcu::TestLog::EndMessage;
		m_log << tcu::TestLog::Message << fragmentShader << tcu::TestLog::EndMessage;
		m_log << tcu::TestLog::Message << buffer << tcu::TestLog::EndMessage;
		TCU_FAIL("Failed to link program");
	}

	if (screen)
	{
		width = screen->getWidth();
		height = screen->getHeight();
	}

	static const GLfloat coords[] = {
		-0.9f, -0.9f,
		 0.9f, -0.9f,
		 0.9f,  0.9f,
		-0.9f,  0.9f
	};

	static const GLfloat colors [] = {
		0.0f, 0.0f, 0.0f, 1.0f,
		1.0f, 0.0f, 0.0f, 1.0f,
		0.0f, 1.0f, 0.0f, 1.0f,
		0.0f, 0.0f, 1.0f, 1.0f
	};

	static const GLushort indices[] = {
		0, 1, 2,
		2, 3, 0
	};

	GLU_CHECK_GLW_CALL(m_gl, viewport(0, 0, width, height));

	GLU_CHECK_GLW_CALL(m_gl, clearColor(1.0f, 0.0f, 0.0f, 1.0f));
	GLU_CHECK_GLW_CALL(m_gl, clear(GL_COLOR_BUFFER_BIT));

	GLU_CHECK_GLW_CALL(m_gl, useProgram(program));

	GLuint coordLocation = m_gl.getAttribLocation(program, "a_pos");
	GLU_CHECK_GLW_MSG(m_gl, "glGetAttribLocation()");
	TCU_CHECK(coordLocation != (GLuint)-1);

	GLuint colorLocation = m_gl.getAttribLocation(program, "a_color");
	GLU_CHECK_GLW_MSG(m_gl, "glGetAttribLocation()");
	TCU_CHECK(colorLocation != (GLuint)-1);

	GLU_CHECK_GLW_CALL(m_gl, enableVertexAttribArray(colorLocation));
	GLU_CHECK_GLW_CALL(m_gl, enableVertexAttribArray(coordLocation));

	GLU_CHECK_GLW_CALL(m_gl, vertexAttribPointer(colorLocation, 4, GL_FLOAT, GL_FALSE, 0, colors));
	GLU_CHECK_GLW_CALL(m_gl, vertexAttribPointer(coordLocation, 2, GL_FLOAT, GL_FALSE, 0, coords));

	GLU_CHECK_GLW_CALL(m_gl, drawElements(GL_TRIANGLES, 6, GL_UNSIGNED_SHORT, indices));
	GLU_CHECK_GLW_CALL(m_gl, disableVertexAttribArray(coordLocation));
	GLU_CHECK_GLW_CALL(m_gl, disableVertexAttribArray(colorLocation));
	GLU_CHECK_GLW_CALL(m_gl, useProgram(0));

	if (screen)
	{
		m_gl.readPixels(0, 0, screen->getWidth(), screen->getHeight(), GL_RGBA, GL_UNSIGNED_BYTE, screen->getAccess().getDataPtr());

		tcu::clear(reference->getAccess(), tcu::IVec4(0xff, 0, 0, 0xff));

		int x1 = (int)(((float)width/2.0f)  * (-0.9f) + ((float)width/2.0f));
		int x2 = (int)(((float)width/2.0f)  *   0.9f  + ((float)width/2.0f));
		int y1 = (int)(((float)height/2.0f) * (-0.9f) + ((float)height/2.0f));
		int y2 = (int)(((float)height/2.0f) *   0.9f  + ((float)height/2.0f));

		for (int x = x1; x <= x2; x++)
		{
			for (int y = y1; y <= y2; y++)
			{
				float t = ((float)(x-x1) / (float)(x2-x1));
				float s = ((float)(y-y1) / (float)(y2-y1));
				bool isUpper = t > s;

				tcu::Vec4 a(colors[0],		colors[1],		colors[2],		colors[3]);
				tcu::Vec4 b(colors[4 + 0],	colors[4 + 1],	colors[4 + 2],	colors[4 + 3]);
				tcu::Vec4 c(colors[8 + 0],	colors[8 + 1],	colors[8 + 2],	colors[8 + 3]);
				tcu::Vec4 d(colors[12 + 0],	colors[12 + 1],	colors[12 + 2],	colors[12 + 3]);


				tcu::Vec4 color;

				if (isUpper)
					color = a * (1.0f - t)  + b * (t - s) + s * c;
				else
					color = a * (1.0f - s)  + d * (s - t) + t * c;

				int red		= deClamp32((int)(255.0f * color.x()), 0, 255);
				int green	= deClamp32((int)(255.0f * color.y()), 0, 255);
				int blue	= deClamp32((int)(255.0f * color.z()), 0, 255);
				int alpha	= deClamp32((int)(255.0f * color.w()), 0, 255);

				reference->setPixel(x, y, tcu::RGBA(red, green, blue, alpha));
			}
		}
	}
}